

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O0

unordered_map<string,_char2double> * __thiscall
ProbMap::createTransitionDict(ProbMap *this,string2int32 *freq_dict)

{
  initializer_list<robin_hood::pair<char,_double>_> initlist;
  initializer_list<robin_hood::pair<char,_double>_> initlist_00;
  initializer_list<robin_hood::pair<char,_double>_> initlist_01;
  bool bVar1;
  int32_t iVar2;
  reference this_00;
  size_type sVar3;
  undefined8 in_RDX;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  key_type *in_RSI;
  unordered_map<string,_char2double> *in_RDI;
  undefined1 auVar4 [64];
  iterator iVar5;
  string2int32 *in_stack_000001c0;
  ProbMap *in_stack_000001c8;
  double csum;
  int32_t C;
  int32_t G;
  int32_t T;
  int32_t A;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *ele;
  iterator __end1;
  iterator __begin1;
  string2int32 *__range1;
  unordered_map<string,_char2double> *fd_map;
  type in_stack_fffffffffffffc88;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc90;
  type in_stack_fffffffffffffc98;
  type in_stack_fffffffffffffca0;
  string2int32 *in_stack_fffffffffffffca8;
  int32_t in_stack_fffffffffffffcb4;
  char base;
  int32_t in_stack_fffffffffffffcb8;
  int32_t in_stack_fffffffffffffcbc;
  char local_2fc [4];
  undefined1 local_2f8 [32];
  pair<char,double> local_2d8 [16];
  pair<char,double> local_2c8 [16];
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2b8;
  undefined8 local_2b0;
  undefined1 local_268 [64];
  undefined1 *local_220;
  undefined8 local_218;
  double local_1d0;
  char local_1c1;
  double local_1c0;
  char local_1b1;
  double local_1b0;
  char local_1a1;
  double local_1a0;
  char local_191;
  undefined1 local_190 [32];
  pair<char,_double> local_170;
  pair<char,_double> local_160;
  string2int32 *local_150;
  undefined8 local_148;
  double local_108;
  int32_t local_dc [10];
  int32_t local_b4 [10];
  int32_t local_8c [10];
  int32_t local_64;
  reference local_60;
  iterator local_58 [2];
  iterator local_38;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  calcFirstBase(in_stack_000001c8,in_stack_000001c0);
  local_28 = local_18;
  local_38 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffc90);
  this_01 = (Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38.mInfo;
  iVar5 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1558be);
  local_58[0] = iVar5;
  while( true ) {
    bVar1 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<false>::operator!=((Iter<false> *)&local_38,local_58);
    if (!bVar1) break;
    this_00 = robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::Iter<false>::operator*((Iter<false> *)0x15590f);
    local_60 = this_00;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (&this_00->first);
    base = (char)((uint)in_stack_fffffffffffffcb4 >> 0x18);
    if ((int)sVar3 < *(int *)&(in_RSI->_M_dataplus)._M_p) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mKeyVals
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mInfo);
      in_stack_fffffffffffffcbc =
           checkFd((string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),base,
                   in_stack_fffffffffffffca8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc90);
      local_64 = in_stack_fffffffffffffcbc;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mKeyVals
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mInfo);
      in_stack_fffffffffffffcb8 =
           checkFd((string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),base,
                   in_stack_fffffffffffffca8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc90);
      local_8c[0] = in_stack_fffffffffffffcb8;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mKeyVals
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mInfo);
      in_stack_fffffffffffffcb4 =
           checkFd((string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),base,
                   in_stack_fffffffffffffca8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc90);
      local_b4[0] = in_stack_fffffffffffffcb4;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mKeyVals
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar5.mInfo);
      iVar2 = checkFd((string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                      (char)((uint)in_stack_fffffffffffffcb4 >> 0x18),in_stack_fffffffffffffca8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc90);
      local_dc[0] = iVar2;
      if (((ulong)(in_RSI->_M_dataplus)._M_p & 0x100000000) == 0) {
        local_2fc[3] = 0x41;
        in_stack_fffffffffffffc90 =
             (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2f8;
        robin_hood::pair<char,double>::pair<char,int&>
                  ((pair<char,double> *)in_stack_fffffffffffffc90,local_2fc + 3,&local_64);
        local_2fc[2] = 0x54;
        robin_hood::pair<char,double>::pair<char,int&>
                  ((pair<char,double> *)(local_2f8 + 0x10),local_2fc + 2,local_8c);
        local_2fc[1] = 0x43;
        robin_hood::pair<char,double>::pair<char,int&>(local_2d8,local_2fc + 1,local_dc);
        local_2fc[0] = 'G';
        robin_hood::pair<char,double>::pair<char,int&>(local_2c8,local_2fc,local_b4);
        local_2b0 = 4;
        initlist_01._M_array._4_4_ = in_stack_fffffffffffffcbc;
        initlist_01._M_array._0_4_ = in_stack_fffffffffffffcb8;
        initlist_01._M_len = (size_type)this_00;
        local_2b8 = in_stack_fffffffffffffc90;
        robin_hood::detail::
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
                  ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                    *)CONCAT44(in_stack_fffffffffffffcb4,iVar2),initlist_01,
                   (size_t)in_stack_fffffffffffffca8,(hash<char,_void> *)in_stack_fffffffffffffca0,
                   (equal_to<char> *)in_stack_fffffffffffffc98);
        in_stack_fffffffffffffc88 =
             robin_hood::detail::
             Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::
             operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                       (this_01,in_RSI);
        robin_hood::detail::
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
        operator=((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                   *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        robin_hood::detail::
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::~Table
                  ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                    *)0x155ef6);
      }
      else {
        local_108 = (double)local_60->second;
        if ((local_108 != 0.0) || (NAN(local_108))) {
          local_191 = 'A';
          local_1a0 = (double)local_64 / local_108;
          in_stack_fffffffffffffca8 = (string2int32 *)local_190;
          robin_hood::pair<char,_double>::pair
                    ((pair<char,_double> *)in_stack_fffffffffffffca8,&local_191,&local_1a0);
          local_1a1 = 'T';
          local_1b0 = (double)local_8c[0] / local_108;
          robin_hood::pair<char,_double>::pair
                    ((pair<char,_double> *)(local_190 + 0x10),&local_1a1,&local_1b0);
          local_1b1 = 'C';
          local_1c0 = (double)local_dc[0] / local_108;
          robin_hood::pair<char,_double>::pair(&local_170,&local_1b1,&local_1c0);
          local_1c1 = 'G';
          local_1d0 = (double)local_b4[0] / local_108;
          robin_hood::pair<char,_double>::pair(&local_160,&local_1c1,&local_1d0);
          local_148 = 4;
          initlist._M_array._4_4_ = in_stack_fffffffffffffcbc;
          initlist._M_array._0_4_ = in_stack_fffffffffffffcb8;
          initlist._M_len = (size_type)this_00;
          local_150 = in_stack_fffffffffffffca8;
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
                    ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                      *)CONCAT44(in_stack_fffffffffffffcb4,iVar2),initlist,
                     (size_t)in_stack_fffffffffffffca8,(hash<char,_void> *)in_stack_fffffffffffffca0
                     ,(equal_to<char> *)in_stack_fffffffffffffc98);
          in_stack_fffffffffffffca0 =
               robin_hood::detail::
               Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
               ::
               operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                         (this_01,in_RSI);
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
          operator=((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                     *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
          ~Table((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                  *)0x155c51);
        }
        else {
          auVar4 = vmovdqu64_avx512f(_DAT_001f0368);
          local_268 = vmovdqu64_avx512f(auVar4);
          local_220 = local_268;
          local_218 = 4;
          initlist_00._M_array._4_4_ = in_stack_fffffffffffffcbc;
          initlist_00._M_array._0_4_ = in_stack_fffffffffffffcb8;
          initlist_00._M_len = (size_type)this_00;
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
                    ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                      *)CONCAT44(in_stack_fffffffffffffcb4,iVar2),initlist_00,
                     (size_t)in_stack_fffffffffffffca8,(hash<char,_void> *)in_stack_fffffffffffffca0
                     ,(equal_to<char> *)in_stack_fffffffffffffc98);
          in_stack_fffffffffffffc98 =
               robin_hood::detail::
               Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
               ::
               operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                         (this_01,in_RSI);
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
          operator=((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                     *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
          ~Table((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                  *)0x155dcc);
        }
      }
    }
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<false>::operator++((Iter<false> *)in_stack_fffffffffffffc90);
  }
  return in_RDI;
}

Assistant:

robin_hood::unordered_map<string, char2double> ProbMap::createTransitionDict(string2int32 &freq_dict) {
    robin_hood::unordered_map<string, char2double> fd_map = calcFirstBase(freq_dict);
    for (const auto &ele: freq_dict) {
        if ((int)ele.first.length() < codewordLen) {
            int32_t A = checkFd(ele.first, 'A', freq_dict);
            int32_t T = checkFd(ele.first, 'T', freq_dict);
            int32_t G = checkFd(ele.first, 'G', freq_dict);
            int32_t C = checkFd(ele.first, 'C', freq_dict);
            if (normalized) {
                double csum = ele.second;//A + T + G + C;
                if (static_cast<bool>(csum)) {
                    fd_map[ele.first] = {{'A', 1.0 * A / csum},
                                         {'T', 1.0 * T / csum},
                                         {'C', 1.0 * C / csum},
                                         {'G', 1.0 * G / csum}};
                } else {
                    fd_map[ele.first] = {{'A', 0.0},
                                         {'T', 0.0},
                                         {'C', 0.0},
                                         {'G', 0.0}};
                }
            } else {
                fd_map[ele.first] = {{'A', A},
                                     {'T', T},
                                     {'C', C},
                                     {'G', G}};
            }
        }
    }
    return fd_map;
}